

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

int __thiscall PP_Expression::conditional_expression(PP_Expression *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = logical_OR_expression(this);
  lVar1 = (this->super_Parser).index;
  iVar3 = iVar2;
  if ((lVar1 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar1].token == PP_QUESTION)) {
    (this->super_Parser).index = lVar1 + 1;
    iVar3 = conditional_expression(this);
    lVar1 = (this->super_Parser).index;
    iVar4 = 0;
    if ((lVar1 < (this->super_Parser).symbols.d.size) &&
       ((this->super_Parser).symbols.d.ptr[lVar1].token == COLON)) {
      (this->super_Parser).index = lVar1 + 1;
      iVar4 = conditional_expression(this);
    }
    if (iVar2 == 0) {
      iVar3 = iVar4;
    }
  }
  return iVar3;
}

Assistant:

int PP_Expression::conditional_expression()
{
    int value = logical_OR_expression();
    if (test(PP_QUESTION)) {
        int alt1 = conditional_expression();
        int alt2 = test(PP_COLON) ? conditional_expression() : 0;
        return value ? alt1 : alt2;
    }
    return value;
}